

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::string_t,double,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric>>
               (string_t *ldata,double *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  sel_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  double dVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ValidityMask *pVVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  ValidityMask *pVVar9;
  idx_t idx_in_entry;
  ValidityMask *pVVar10;
  string_t input;
  string_t input_00;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = sel_vector->sel_vector;
      pVVar10 = (ValidityMask *)0x0;
      pVVar9 = result_mask;
      do {
        pVVar6 = pVVar10;
        if (psVar1 != (sel_t *)0x0) {
          pVVar6 = (ValidityMask *)(ulong)psVar1[(long)pVVar10];
        }
        input_00.value.pointer.ptr = (char *)result_mask;
        input_00.value._0_8_ = ldata[(long)pVVar6].value.pointer.ptr;
        dVar3 = VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric>::
                Operation<duckdb::string_t,double>
                          (*(VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric> **)
                            &ldata[(long)pVVar6].value,input_00,pVVar10,(idx_t)dataptr,pVVar9);
        result_data[(long)pVVar10] = dVar3;
        pVVar10 = (ValidityMask *)
                  ((long)&(pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
      } while ((ValidityMask *)count != pVVar10);
    }
  }
  else if (count != 0) {
    psVar1 = sel_vector->sel_vector;
    local_40 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    pVVar10 = (ValidityMask *)0x0;
    pVVar9 = result_mask;
    do {
      pVVar6 = pVVar10;
      if (psVar1 != (sel_t *)0x0) {
        pVVar6 = (ValidityMask *)(ulong)psVar1[(long)pVVar10];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[(ulong)pVVar6 >> 6] >>
           ((ulong)pVVar6 & 0x3f) & 1) == 0) {
        _Var8._M_head_impl = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
        ;
        if (_Var8._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var5 = p_Stack_50;
          peVar4 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          _Var8._M_head_impl =
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var8._M_head_impl;
        }
        bVar2 = (byte)pVVar10 & 0x3f;
        _Var8._M_head_impl[(ulong)pVVar10 >> 6] =
             _Var8._M_head_impl[(ulong)pVVar10 >> 6] &
             (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      else {
        input.value.pointer.ptr = (char *)result_mask;
        input.value._0_8_ = ldata[(long)pVVar6].value.pointer.ptr;
        dVar3 = VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric>::
                Operation<duckdb::string_t,double>
                          (*(VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric> **)
                            &ldata[(long)pVVar6].value,input,pVVar10,(idx_t)dataptr,pVVar9);
        result_data[(long)pVVar10] = dVar3;
      }
      pVVar10 = (ValidityMask *)
                ((long)&(pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
    } while ((ValidityMask *)count != pVVar10);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}